

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_softmax_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::FastSoftmaxTest_DISABLED_Speed_Test::~FastSoftmaxTest_DISABLED_Speed_Test
          (FastSoftmaxTest_DISABLED_Speed_Test *this)

{
  anon_unknown.dwarf_16a6fc6::FastSoftmaxTest_DISABLED_Speed_Test::
  ~FastSoftmaxTest_DISABLED_Speed_Test((FastSoftmaxTest_DISABLED_Speed_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(FastSoftmaxTest, DISABLED_Speed) {
  constexpr int kNumTimes = 1000000;
  RunSoftmaxSpeedTest(kNumTimes);
}